

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

string * __thiscall
pfederc::LoopExpr::toString_abi_cxx11_(string *__return_storage_ptr__,LoopExpr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Expr *pEVar2;
  char cVar3;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar3 = (char)__return_storage_ptr__;
  if ((this->super_Expr).type == EXPR_LOOP_DO) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((this->initExpr)._M_t.
        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl == (Expr *)0x0)
    goto LAB_0011bf8b;
    std::__cxx11::string::push_back(cVar3);
    (*((this->initExpr)._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_40);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_0011bf8b;
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pEVar2 = (this->initExpr)._M_t.
             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
             super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    if (pEVar2 != (Expr *)0x0) {
      (*pEVar2->_vptr_Expr[2])(&local_40);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    (*((this->condExpr)._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_40);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((this->itExpr)._M_t.
        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl == (Expr *)0x0)
    goto LAB_0011bf8b;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*((this->itExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
       ._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_40);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_0011bf8b;
  }
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
LAB_0011bf8b:
  std::__cxx11::string::push_back(cVar3);
  BodyExpr::toString_abi_cxx11_
            (&local_40,
             (this->bodyExpr)._M_t.
             super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
             super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::push_back(cVar3);
  if ((this->super_Expr).type == EXPR_LOOP_DO) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*((this->condExpr)._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_40);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((this->itExpr)._M_t.
        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      (*((this->itExpr)._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_40);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LoopExpr::toString() const noexcept {
  std::string result;
  if (getType() == ExprType::EXPR_LOOP_DO) {
    result += "do";
    if (initExpr) {
      result += ' ';
      result += initExpr->toString();
    }
  } else {
    result += "for ";
    if (initExpr) {
      result += initExpr->toString();
      result += "; ";
    }
    result += condExpr->toString();
    if (itExpr) {
      result += "; ";
      result += itExpr->toString();
    }
  }

  result += '\n';
  result += bodyExpr->toString();
  result += ';';

  if (getType() == ExprType::EXPR_LOOP_DO) {
    result += " for ";
    result += condExpr->toString();
    if (itExpr) {
      result += "; ";
      result += itExpr->toString();
    }
  }

  return result;
}